

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_udmf.cpp
# Opt level: O2

void __thiscall UDMFParser::ParseVertex(UDMFParser *this,vertex_t *vt,vertexdata_t *vd)

{
  double dVar1;
  bool bVar2;
  FName key;
  double local_40;
  double local_38;
  
  (vt->p).X = 0.0;
  (vt->p).Y = 0.0;
  vd->zCeiling = 0.0;
  vd->zFloor = 0.0;
  vd->flags = 0;
  FScanner::MustGetToken((FScanner *)this,0x7b);
  while( true ) {
    bVar2 = FScanner::CheckToken((FScanner *)this,0x7d);
    if (bVar2) break;
    UDMFParserBase::ParseKey((UDMFParserBase *)&key,SUB81(this,0),(bool *)0x0);
    if (key.Index == 0x109) {
      dVar1 = UDMFParserBase::CheckFloat
                        (&this->super_UDMFParserBase,FName::NameData.NameArray[0x109].Text);
      vd->zCeiling = dVar1;
      *(byte *)&vd->flags = (byte)vd->flags | 1;
    }
    else if (key.Index == 0xeb) {
      local_40 = UDMFParserBase::CheckFloat
                           (&this->super_UDMFParserBase,FName::NameData.NameArray[0xeb].Text);
    }
    else if (key.Index == 0x108) {
      dVar1 = UDMFParserBase::CheckFloat
                        (&this->super_UDMFParserBase,FName::NameData.NameArray[0x108].Text);
      vd->zFloor = dVar1;
      *(byte *)&vd->flags = (byte)vd->flags | 2;
    }
    else if (key.Index == 0xea) {
      local_38 = UDMFParserBase::CheckFloat
                           (&this->super_UDMFParserBase,FName::NameData.NameArray[0xea].Text);
    }
  }
  (vt->p).X = local_38;
  (vt->p).Y = local_40;
  return;
}

Assistant:

void ParseVertex(vertex_t *vt, vertexdata_t *vd)
	{
		vt->set(0, 0);
		vd->zCeiling = vd->zFloor = vd->flags = 0;

		sc.MustGetToken('{');
		double x, y;
		while (!sc.CheckToken('}'))
		{
			FName key = ParseKey();
			switch (key)
			{
			case NAME_X:
				x = CheckFloat(key);
				break;

			case NAME_Y:
				y = CheckFloat(key);
				break;

			case NAME_ZCeiling:
				vd->zCeiling = CheckFloat(key);
				vd->flags |= VERTEXFLAG_ZCeilingEnabled;
				break;

			case NAME_ZFloor:
				vd->zFloor = CheckFloat(key);
				vd->flags |= VERTEXFLAG_ZFloorEnabled;
				break;

			default:
				break;
			}
		}
		vt->set(x, y);
	}